

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vloc.cc
# Opt level: O2

ostream * tchecker::output(ostream *os,vloc_t *vloc,system_t *system)

{
  uint uVar1;
  long lVar2;
  pointer local_40;
  
  uVar1 = (vloc->super_loc_array_t).super_vloc_base_t.super_array_capacity_t<unsigned_int>._capacity
  ;
  std::operator<<(os,"<");
  for (lVar2 = 0; (ulong)uVar1 << 2 != lVar2; lVar2 = lVar2 + 4) {
    if (lVar2 != 0) {
      std::operator<<(os,",");
    }
    tchecker::system::locs_t::location((locs_t *)&stack0xffffffffffffffc0,(int)system + 0x230);
    std::operator<<(os,(string *)
                       &(local_40->
                        super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  std::operator<<(os,">");
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::vloc_t const & vloc, tchecker::system::system_t const & system)
{
  auto begin = vloc.begin(), end = vloc.end();
  os << "<";
  for (auto it = begin; it != end; ++it) {
    if (it != begin)
      os << ",";
    os << system.location(*it)->name();
  }
  os << ">";
  return os;
}